

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *
detail::
deserialize_helper<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
::apply(vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        *__return_storage_ptr__,const_iterator *begin,const_iterator end)

{
  unsigned_long __n;
  reference this;
  pair<unsigned_int,_float> local_58;
  ulong local_50;
  size_t i;
  allocator<std::pair<unsigned_int,_float>_> local_32;
  undefined1 local_31;
  uchar *local_30;
  unsigned_long local_28;
  size_t size;
  const_iterator *begin_local;
  const_iterator end_local;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *vect;
  
  local_30 = end._M_current;
  size = (size_t)begin;
  begin_local = (const_iterator *)end._M_current;
  end_local._M_current = (uchar *)__return_storage_ptr__;
  __n = deserialize_helper<unsigned_long>::apply(begin,end);
  local_31 = 0;
  local_28 = __n;
  std::allocator<std::pair<unsigned_int,_float>_>::allocator(&local_32);
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  vector(__return_storage_ptr__,__n,&local_32);
  std::allocator<std::pair<unsigned_int,_float>_>::~allocator(&local_32);
  for (local_50 = 0; local_50 < local_28; local_50 = local_50 + 1) {
    local_58 = deserialize_helper<std::pair<unsigned_int,_float>_>::apply
                         ((const_iterator *)size,(const_iterator)begin_local);
    this = std::
           vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           ::operator[](__return_storage_ptr__,local_50);
    std::pair<unsigned_int,_float>::operator=(this,&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> apply(StreamType::const_iterator& begin,
                                    StreamType::const_iterator end)
        {
            // retrieve the number of elements
            size_t size = deserialize_helper<size_t>::apply(begin, end);

            std::vector<T> vect(size);
            for (size_t i = 0; i < size; ++i)
            {
                vect[i] = std::move(deserialize_helper<T>::apply(begin, end));
            }
            return vect;
        }